

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISInputManager.cpp
# Opt level: O0

void OIS::InputManager::destroyInputSystem(InputManager *manager)

{
  bool bVar1;
  pointer ppVar2;
  long *in_RDI;
  iterator i;
  map<OIS::Object_*,_OIS::FactoryCreator_*,_std::less<OIS::Object_*>,_std::allocator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>_>
  *in_stack_ffffffffffffffd8;
  _Rb_tree_iterator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_> *this;
  _Self local_18;
  _Self local_10;
  long *local_8;
  
  if (in_RDI != (long *)0x0) {
    local_8 = in_RDI;
    local_10._M_node =
         (_Base_ptr)
         std::
         map<OIS::Object_*,_OIS::FactoryCreator_*,_std::less<OIS::Object_*>,_std::allocator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>_>
         ::begin(in_stack_ffffffffffffffd8);
    while( true ) {
      local_18._M_node =
           (_Base_ptr)
           std::
           map<OIS::Object_*,_OIS::FactoryCreator_*,_std::less<OIS::Object_*>,_std::allocator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>_>
           ::end(in_stack_ffffffffffffffd8);
      bVar1 = std::operator!=(&local_10,&local_18);
      if (!bVar1) break;
      ppVar2 = std::_Rb_tree_iterator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>::
               operator->((_Rb_tree_iterator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>
                           *)0x147e9b);
      this = (_Rb_tree_iterator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_> *)
             ppVar2->second;
      ppVar2 = std::_Rb_tree_iterator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>::
               operator->((_Rb_tree_iterator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>
                           *)0x147eae);
      (*(code *)this->_M_node[1]._M_right)(this,ppVar2->first);
      std::_Rb_tree_iterator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>::operator++
                (this);
    }
    std::
    map<OIS::Object_*,_OIS::FactoryCreator_*,_std::less<OIS::Object_*>,_std::allocator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>_>
    ::clear((map<OIS::Object_*,_OIS::FactoryCreator_*,_std::less<OIS::Object_*>,_std::allocator<std::pair<OIS::Object_*const,_OIS::FactoryCreator_*>_>_>
             *)0x147ed6);
    if (local_8 != (long *)0x0) {
      (**(code **)(*local_8 + 0x10))();
    }
  }
  return;
}

Assistant:

void InputManager::destroyInputSystem(InputManager* manager)
{
	if(manager == nullptr)
		return;

	//Cleanup before deleting...
	for(FactoryCreatedObject::iterator i = manager->mFactoryObjects.begin();
		i != manager->mFactoryObjects.end();
		++i)
	{
		i->second->destroyObject(i->first);
	}

	manager->mFactoryObjects.clear();
	delete manager;
}